

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

char * __thiscall CVmTimeZone::get_name(CVmTimeZone *this,size_t *len)

{
  size_t sVar1;
  size_t sVar2;
  size_t *in_RSI;
  long *in_RDI;
  char *local_8;
  
  if (in_RDI[1] == 0) {
    if (*in_RDI == 0) {
      sVar1 = strlen((char *)in_RDI[8]);
      *in_RSI = sVar1;
      local_8 = (char *)in_RDI[8];
    }
    else {
      sVar2 = CVmHashEntry::getlen((CVmHashEntry *)*in_RDI);
      *in_RSI = sVar2;
      local_8 = CVmHashEntry::getstr((CVmHashEntry *)*in_RDI);
    }
  }
  else {
    sVar1 = strlen((char *)in_RDI[1]);
    *in_RSI = sVar1;
    local_8 = (char *)in_RDI[1];
  }
  return local_8;
}

Assistant:

const char *CVmTimeZone::get_name(size_t &len) const
{
    /* use the name, or the hash table name, or the primary abbreviation */
    if (name_ != 0)
    {
        /* we have an explicit name field - use it */
        len = strlen(name_);
        return name_;
    }
    else if (hashentry_ != 0)
    {
        /* get the name from our hash table entry */
        len = hashentry_->getlen();
        return hashentry_->getstr();
    }
    else
    {
        /* no name or hash entry - use our primary abbreviation */
        len = strlen(abbr_);
        return abbr_;
    }
}